

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O0

int arkLs_AccessMassMem(ARKodeMem ark_mem,char *fname,ARKLsMassMem *arkls_mem)

{
  void *pvVar1;
  undefined8 *in_RDX;
  char *in_RSI;
  ARKodeMem in_RDI;
  void *ark_step_massmem;
  int local_4;
  
  pvVar1 = (*in_RDI->step_getmassmem)(in_RDI);
  if (pvVar1 == (void *)0x0) {
    arkProcessError(in_RDI,-6,0xfe9,in_RSI,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_ls.c"
                    ,"Mass matrix solver memory is NULL.");
    local_4 = -6;
  }
  else {
    *in_RDX = pvVar1;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int arkLs_AccessMassMem(ARKodeMem ark_mem, const char* fname,
                        ARKLsMassMem* arkls_mem)
{
  void* ark_step_massmem;
  ark_step_massmem = ark_mem->step_getmassmem(ark_mem);
  if (ark_step_massmem == NULL)
  {
    arkProcessError(ark_mem, ARKLS_MASSMEM_NULL, __LINE__, fname, __FILE__,
                    MSG_LS_MASSMEM_NULL);
    return (ARKLS_MASSMEM_NULL);
  }
  *arkls_mem = (ARKLsMassMem)ark_step_massmem;
  return (ARKLS_SUCCESS);
}